

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcLaborResource::~IfcLaborResource(IfcLaborResource *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)&this->super_IfcConstructionResource = 0x810b70;
  *(undefined8 *)&this->field_0x1b0 = 0x810c60;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x88 = 0x810b98;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x98 = 0x810bc0;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0xd0 = 0x810be8;
  (this->super_IfcConstructionResource).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcConstructionResource,_4UL>._vptr_ObjectHelper =
       (_func_int **)0x810c10;
  *(undefined8 *)&(this->super_IfcConstructionResource).field_0x178 = 0x810c38;
  puVar1 = *(undefined1 **)&(this->super_IfcConstructionResource).field_0x188;
  if (puVar1 != &this->field_0x198) {
    operator_delete(puVar1,*(long *)&this->field_0x198 + 1);
  }
  IfcConstructionResource::~IfcConstructionResource
            (&this->super_IfcConstructionResource,&PTR_construction_vtable_24__00810c78);
  operator_delete(this,0x1c8);
  return;
}

Assistant:

IfcLaborResource() : Object("IfcLaborResource") {}